

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

bool __thiscall IR::ListOpnd::IsEqualInternal(ListOpnd *this,Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ListOpndType *pLVar5;
  ListOpndType *pLVar6;
  int i;
  
  if ((this->super_Opnd).m_kind != OpndKindList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x94d,"(m_kind == OpndKindList)","m_kind == OpndKindList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((opnd->m_kind == OpndKindList) && (*(int *)&opnd[1]._vptr_Opnd == this->count)) {
    bVar2 = this->count < 1;
    if (0 < this->count) {
      pLVar5 = Item(this,0);
      pLVar6 = Item((ListOpnd *)opnd,0);
      bVar3 = Opnd::IsEqual(&pLVar5->super_Opnd,&pLVar6->super_Opnd);
      if (bVar3) {
        i = 1;
        do {
          bVar2 = this->count <= i;
          if (this->count <= i) {
            return bVar2;
          }
          pLVar5 = Item(this,i);
          pLVar6 = Item((ListOpnd *)opnd,i);
          bVar3 = Opnd::IsEqual(&pLVar5->super_Opnd,&pLVar6->super_Opnd);
          i = i + 1;
        } while (bVar3);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ListOpnd::IsEqualInternal(Opnd * opnd)
{
    Assert(m_kind == OpndKindList);
    if (!opnd->IsListOpnd())
    {
        return false;
    }
    ListOpnd* l2 = opnd->AsListOpnd();
    if (l2->Count() != Count())
    {
        return false;
    }
    for (int i = 0; i < Count(); ++i)
    {
        if (!Item(i)->IsEqual(l2->Item(i)))
        {
            return false;
        }
    }
    return true;
}